

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestEmptyMapEntriesIntValuePopulatedInGenCode_Test::
~NoFieldPresenceTest_TestEmptyMapEntriesIntValuePopulatedInGenCode_Test
          (NoFieldPresenceTest_TestEmptyMapEntriesIntValuePopulatedInGenCode_Test *this)

{
  NoFieldPresenceTest_TestEmptyMapEntriesIntValuePopulatedInGenCode_Test *this_local;
  
  ~NoFieldPresenceTest_TestEmptyMapEntriesIntValuePopulatedInGenCode_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestEmptyMapEntriesIntValuePopulatedInGenCode) {
  // Set zero values for zero keys and test that.
  TestAllMapTypes message;
  (*message.mutable_map_int32_foreign_enum())[0];

  EXPECT_EQ(1, message.map_int32_foreign_enum().size());
  EXPECT_TRUE(message.map_int32_foreign_enum().contains(0));
  EXPECT_EQ(1, message.map_int32_foreign_enum().count(0));
  EXPECT_EQ(0, message.map_int32_foreign_enum().at(0));

  // Note that `has_foo` APIs are not available for implicit presence fields.
  // So there is no way to check has_field behaviour in gencode.
}